

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskNode.cpp
# Opt level: O2

ostream * operator<<(ostream *out,TaskNode *taskNode)

{
  string *psVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  const_iterator __end1;
  
  poVar2 = std::operator<<(out,"Task: ");
  poVar2 = std::operator<<(poVar2,(string *)taskNode);
  poVar2 = std::operator<<(poVar2,". Dependants: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  p_Var3 = (_List_node_base *)&taskNode->dependant;
  while (p_Var3 = (((_List_base<TaskNode_*,_std::allocator<TaskNode_*>_> *)&p_Var3->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&taskNode->dependant) {
    psVar1 = (string *)p_Var3[1]._M_next;
    poVar2 = std::operator<<(out,'\n');
    std::operator<<(poVar2,psVar1);
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const TaskNode &taskNode) {
    out << "Task: " << taskNode.name << ". Dependants: " << taskNode.dependant.size();

    for (TaskNode *dependant : taskNode.dependant) {
        out << '\n' << dependant->getName();
    }

    return out;
}